

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSValue JS_NewSymbol(JSContext *ctx,JSString *p,int atom_type)

{
  long lVar1;
  JSAtom JVar2;
  JSContext *in_RSI;
  long in_RDI;
  JSAtom atom;
  JSString *unaff_retaddr;
  JSRuntime *rt;
  undefined8 local_10;
  
  lVar1 = *(long *)(in_RDI + 0x18);
  JVar2 = __JS_NewAtom(rt,unaff_retaddr,local_10._12_4_);
  if (JVar2 == 0) {
    _local_10 = JS_ThrowOutOfMemory(in_RSI);
  }
  else {
    stack0xfffffffffffffff8 = -8;
    local_10 = ((JSValueUnion *)(*(long *)(lVar1 + 0x60) + (ulong)JVar2 * 8))->ptr;
  }
  return _local_10;
}

Assistant:

static JSValue JS_NewSymbol(JSContext *ctx, JSString *p, int atom_type)
{
    JSRuntime *rt = ctx->rt;
    JSAtom atom;
    atom = __JS_NewAtom(rt, p, atom_type);
    if (atom == JS_ATOM_NULL)
        return JS_ThrowOutOfMemory(ctx);
    return JS_MKPTR(JS_TAG_SYMBOL, rt->atom_array[atom]);
}